

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O0

void __thiscall pg::SSPMSolver::stream_best(SSPMSolver *this,ostream *out,int h)

{
  ostream *this_00;
  bool bVar1;
  undefined1 local_38 [24];
  int c;
  int i;
  int j;
  int h_local;
  ostream *out_local;
  SSPMSolver *this_local;
  
  i = h;
  _j = out;
  out_local = (ostream *)this;
  if (*this->best_d == -1) {
    std::operator<<(out," \x1b[1;33mTop\x1b[m");
  }
  else {
    std::operator<<(out," { ");
    c = 0;
    for (local_38._20_4_ = 0; (int)local_38._20_4_ < i; local_38._20_4_ = local_38._20_4_ + 1) {
      if (0 < (int)local_38._20_4_) {
        std::operator<<(_j,",");
      }
      local_38._16_4_ = 0;
      while( true ) {
        this_00 = _j;
        bVar1 = false;
        if (c < this->l) {
          bVar1 = this->best_d[c] == local_38._20_4_;
        }
        if (!bVar1) break;
        local_38._16_4_ = local_38._16_4_ + 1;
        bitset::operator[]((bitset *)local_38,(size_t)&this->best_b);
        bVar1 = bitset::reference::operator_cast_to_bool((reference *)local_38);
        std::ostream::operator<<(this_00,bVar1);
        c = c + 1;
      }
      if (local_38._16_4_ == 0) {
        std::operator<<(_j,anon_var_dwarf_1b3ff9);
      }
    }
    std::operator<<(_j," }");
  }
  return;
}

Assistant:

void
SSPMSolver::stream_best(std::ostream &out, int h)
{
    if (best_d[0] == -1) {
        out << " \033[1;33mTop\033[m";
    } else {
        out << " { ";
        int j=0;
        for (int i=0; i<h; i++) {
            if (i>0) out << ",";
            int c=0;
            while (j<l and best_d[j] == i) {
                c++;
                out << best_b[j];
                j++;
            }
            if (c == 0) out << "ε";
        }
        out << " }";
    }
}